

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O1

JavascriptString * __thiscall Js::ScriptFunction::GetDisplayNameImpl(ScriptFunction *this)

{
  ushort uVar1;
  PropertyRecord *pPVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  FunctionProxy *pFVar6;
  undefined4 *puVar7;
  ParseableFunctionInfo *this_00;
  undefined4 extraout_var;
  JavascriptSymbol *pJVar8;
  undefined4 extraout_var_00;
  char16 *name;
  JavascriptString *pJVar9;
  uint sz;
  JavascriptString *local_40;
  JavascriptString *computedName;
  charcount_t length;
  
  pFVar6 = GetFunctionProxy(this);
  if (pFVar6 == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x324,"(this->GetFunctionProxy() != nullptr)",
                                "this->GetFunctionProxy() != nullptr");
    if (!bVar4) goto LAB_00d59e37;
    *puVar7 = 0;
  }
  pFVar6 = GetFunctionProxy(this);
  this_00 = FunctionProxy::EnsureDeserialized(pFVar6);
  computedName._4_4_ = 0;
  EnterPinnedScope(&local_40);
  iVar5 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x76])(this);
  pJVar9 = (JavascriptString *)CONCAT44(extraout_var,iVar5);
  if (pJVar9 == (JavascriptString *)0x0) {
    uVar1 = *(ushort *)&(this_00->super_FunctionProxy).field_0x45;
    if (((uVar1 & 0x20) != 0) ||
       ((name = L"", (uVar1 & 0x40) != 0 &&
        (((((uVar1 & 0xc) != 0 ||
           (((((((((this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
                   super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
            m_ES6FunctionNameFull != false)) ||
          (bVar4 = FunctionProxy::IsLambda(&this_00->super_FunctionProxy), bVar4)) ||
         (iVar5 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x73])(this), CONCAT44(extraout_var_00,iVar5) != 0)
         ))))) {
      name = FunctionProxy::GetShortDisplayName
                       (&this_00->super_FunctionProxy,(charcount_t *)((long)&computedName + 4));
    }
  }
  else {
    bVar4 = VarIs<Js::JavascriptSymbol>(pJVar9);
    if (bVar4) {
      pJVar8 = VarTo<Js::JavascriptSymbol>(pJVar9);
      pPVar2 = (pJVar8->propertyRecordUsageCache).propertyRecord.ptr;
      name = (char16 *)(pPVar2 + 1);
      sz = pPVar2->byteCount >> 1;
      bVar4 = true;
      if (sz != 0) {
        name = FunctionProxy::WrapWithBrackets
                         (name,sz,(((((this->super_ScriptFunctionBase).super_JavascriptFunction.
                                      super_DynamicObject.super_RecyclableObject.type.ptr)->
                                    javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                                  scriptContext.ptr);
        computedName._4_4_ = sz + 2;
      }
    }
    else {
      pJVar9 = GetComputedName(pJVar9,(((((this->super_ScriptFunctionBase).super_JavascriptFunction.
                                          super_DynamicObject.super_RecyclableObject.type.ptr)->
                                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                                      scriptContext.ptr);
      local_40 = pJVar9;
      if (((this_00->super_FunctionProxy).field_0x45 & 8) == 0) {
        name = (char16 *)0x0;
        bVar4 = false;
      }
      else {
        name = JavascriptString::GetString(pJVar9);
        computedName._4_4_ = JavascriptString::GetLength(local_40);
        bVar4 = true;
      }
    }
    if (!bVar4) {
      return pJVar9;
    }
  }
  bVar4 = IsValidCharCount((ulong)computedName._4_4_);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x35c,"(IsValidCharCount(length))",
                                "JavascriptString can\'t be larger than charcount_t");
    if (!bVar4) {
LAB_00d59e37:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pJVar9 = JavascriptFunction::DisplayNameHelper((JavascriptFunction *)this,name,computedName._4_4_)
  ;
  LeavePinnedScope();
  return pJVar9;
}

Assistant:

JavascriptString* ScriptFunction::GetDisplayNameImpl() const
    {
        Assert(this->GetFunctionProxy() != nullptr); // The caller should guarantee a proxy exists
        ParseableFunctionInfo * func = this->GetFunctionProxy()->EnsureDeserialized();
        const char16* name = nullptr;
        charcount_t length = 0;
        JavascriptString* returnStr = nullptr;
        ENTER_PINNED_SCOPE(JavascriptString, computedName);
        Var computedNameVar = this->GetComputedNameVar();
        if (computedNameVar != nullptr)
        {
            const char16* symbolName = nullptr;
            charcount_t symbolNameLength = 0;
            if (ScriptFunction::GetSymbolName(computedNameVar, &symbolName, &symbolNameLength))
            {
                if (symbolNameLength == 0)
                {
                    name = symbolName;
                }
                else
                {
                    name = FunctionProxy::WrapWithBrackets(symbolName, symbolNameLength, this->GetScriptContext());
                    length = symbolNameLength + 2; //adding 2 to length for  brackets
                }
            }
            else
            {
                computedName = ScriptFunction::GetComputedName(computedNameVar, this->GetScriptContext());
                if (!func->GetIsAccessor())
                {
                    return computedName;
                }
                name = computedName->GetString();
                length = computedName->GetLength();
            }
        }
        else
        {
            name = Constants::Empty;
            if (func->GetIsNamedFunctionExpression()) // GetIsNamedFunctionExpression -> ex. var a = function foo() {} where name is foo
            {
                name = func->GetShortDisplayName(&length);
            }
            else if (func->GetIsNameIdentifierRef()) // GetIsNameIdentifierRef        -> confirms a name is not attached like o.x = function() {}
            {
                if (this->GetScriptContext()->GetConfig()->IsES6FunctionNameFullEnabled())
                {
                    name = func->GetShortDisplayName(&length);
                }
                else if (func->GetIsDeclaration() || // GetIsDeclaration -> ex. function foo () {}
                         func->GetIsAccessor()    || // GetIsAccessor    -> ex. var a = { get f() {}} new enough syntax that we do not have to disable by default
                         func->IsLambda()         || // IsLambda         -> ex. var y = { o : () => {}}
                         GetHomeObj())               // GetHomeObj       -> ex. var o = class {}, confirms this is a constructor or method on a class
                {
                    name = func->GetShortDisplayName(&length);
                }
            }
        }
        AssertMsg(IsValidCharCount(length), "JavascriptString can't be larger than charcount_t");
        returnStr = DisplayNameHelper(name, static_cast<charcount_t>(length));

        LEAVE_PINNED_SCOPE();

        return returnStr;
    }